

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void get_range(char *enc,int *min,int *max)

{
  int iVar1;
  char *__nptr;
  long lVar2;
  bool bVar3;
  int val;
  char *ptr1;
  char *ptr;
  int *max_local;
  int *min_local;
  char *enc_local;
  
  ptr1 = enc;
  if (enc != (char *)0x0) {
    while( true ) {
      bVar3 = false;
      if (*ptr1 != '\0') {
        bVar3 = *ptr1 != '-';
      }
      if (!bVar3) break;
      ptr1 = ptr1 + 1;
    }
    if (*ptr1 != '\0') {
      while( true ) {
        bVar3 = false;
        if (*ptr1 != '\0') {
          bVar3 = *ptr1 != '[';
        }
        if (!bVar3) break;
        ptr1 = ptr1 + 1;
      }
      if (*ptr1 != '\0') {
        *min = 0xffff;
        *max = 0;
        while( true ) {
          bVar3 = false;
          if (*ptr1 != '\0') {
            bVar3 = *ptr1 != ']';
          }
          if (!bVar3) break;
          __nptr = ptr1 + 1;
          ptr1 = __nptr;
          while( true ) {
            bVar3 = false;
            if (((*ptr1 != '\0') && (bVar3 = false, *ptr1 != ']')) && (bVar3 = false, *ptr1 != ' '))
            {
              bVar3 = *ptr1 != '_';
            }
            if (!bVar3) break;
            ptr1 = ptr1 + 1;
          }
          lVar2 = strtol(__nptr,(char **)0x0,0);
          iVar1 = (int)lVar2;
          if (iVar1 < *min) {
            *min = iVar1;
          }
          if (*max < iVar1) {
            *max = iVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
get_range(const char	*enc,
	  int 		*min,
	  int		*max) {

  const char *ptr = enc;
  const char *ptr1;

  if (!enc) return;

  while (*ptr && *ptr != '-') ptr++;
  if (!*ptr) return;
  while (*ptr && *ptr != '[') ptr++;
  if (!*ptr) return;
  *min = 0xFFFF;
  *max = 0;
  while (*ptr && *ptr != ']') {
    int val;
    ptr++;
    ptr1 = ptr;
    while (*ptr && *ptr != ']' && *ptr != ' ' && *ptr != '_') ptr++;
    val = strtol(ptr1, NULL, 0);
    if (val < *min) *min = val;
    if (val > *max) *max = val;
  }
}